

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis.c
# Opt level: O0

int vorbis_check_packet(buf_t *buf,uchar type)

{
  uchar type_local;
  buf_t *buf_local;
  
  if (buf != (buf_t *)0x0) {
    if (buf->len < 7) {
      buf_local._4_4_ = 0;
    }
    else if (*buf->data == type) {
      if ((((buf->data[1] == 'v') && (buf->data[2] == 'o')) && (buf->data[3] == 'r')) &&
         (((buf->data[4] == 'b' && (buf->data[5] == 'i')) && (buf->data[6] == 's')))) {
        buf_local._4_4_ = 1;
      }
      else {
        buf_local._4_4_ = 0;
      }
    }
    else {
      buf_local._4_4_ = 0;
    }
    return buf_local._4_4_;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis.c",0x3d,
                "int vorbis_check_packet(buf_t *, unsigned char)");
}

Assistant:

int vorbis_check_packet(buf_t *buf, unsigned char type) {
  assert(buf != NULL);

  if (buf->len < VORBIS_HDR_SIZE)
    return 0;
  if (buf->data[0] != type)
    return 0;
  if ((buf->data[1] != VORBIS_SYNC_HDR_BYTE1) ||
      (buf->data[2] != VORBIS_SYNC_HDR_BYTE2) ||
      (buf->data[3] != VORBIS_SYNC_HDR_BYTE3) ||
      (buf->data[4] != VORBIS_SYNC_HDR_BYTE4) ||
      (buf->data[5] != VORBIS_SYNC_HDR_BYTE5) ||
      (buf->data[6] != VORBIS_SYNC_HDR_BYTE6))
    return 0;

  return 1;
}